

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O1

void convert_rgb_to_rgba(uint8_t *RGB,uint32_t width,uint32_t height,uint8_t **RGBA)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  long lVar7;
  
  puVar2 = (uint8_t *)malloc((ulong)(width * height * 4));
  *RGBA = puVar2;
  if (height != 0) {
    iVar3 = 0;
    uVar4 = 2;
    uVar5 = 0;
    do {
      if (width != 0) {
        lVar7 = 0;
        uVar6 = uVar4;
        do {
          iVar1 = (int)lVar7;
          (*RGBA)[(uint)(iVar3 + iVar1)] = RGB[uVar6 - 2];
          (*RGBA)[(uint)(iVar3 + 1 + iVar1)] = RGB[uVar6 - 1];
          (*RGBA)[(uint)(iVar3 + 2 + iVar1)] = RGB[uVar6];
          (*RGBA)[iVar3 + iVar1 + 3] = '\0';
          lVar7 = lVar7 + 4;
          uVar6 = uVar6 + 3;
        } while ((ulong)width << 2 != lVar7);
      }
      uVar5 = uVar5 + 1;
      iVar3 = iVar3 + width * 4;
      uVar4 = uVar4 + width * 3;
    } while (uVar5 != height);
  }
  return;
}

Assistant:

void convert_rgb_to_rgba(const uint8_t *RGB, uint32_t width, uint32_t height, uint8_t **RGBA)
{
	*RGBA = malloc(4*width*height);
	for(uint32_t y=0; y<height; ++y)
	{
		for(uint32_t x=0; x<width; ++x)
		{
			(*RGBA)[(y*width+x)*4] = RGB[(y*width+x)*3];
			(*RGBA)[(y*width+x)*4+1] = RGB[(y*width+x)*3+1];
			(*RGBA)[(y*width+x)*4+2] = RGB[(y*width+x)*3+2];
			(*RGBA)[(y*width+x)*4+3] = 0;
		}
	}
}